

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

int http_write_end(HTTP_INFO *hi)

{
  int len;
  int iVar1;
  char str [10];
  
  if (hi != (HTTP_INFO *)0x0) {
    if ((hi->request).chunked == '\x01') {
      builtin_strncpy(str,"0\r\n\r\n",6);
      len = 5;
    }
    else {
      str._4_2_ = str._4_2_ & 0xff00;
      builtin_strncpy(str,"\r\n\r\n",4);
      len = 4;
    }
    iVar1 = https_write(hi,str,len);
    if (iVar1 == len) {
      return len;
    }
    https_close(hi);
    _error = iVar1;
  }
  return -1;
}

Assistant:

int http_write_end(HTTP_INFO *hi)
{
    char        str[10];
    int         ret, len;

    if (NULL == hi) return -1;

    if(hi->request.chunked == TRUE)
    {
        len = snprintf(str, 10, "0\r\n\r\n");
    }
    else
    {
        len = snprintf(str, 10, "\r\n\r\n");
    }

    if ((ret = https_write(hi, str, len)) != len)
    {
        https_close(hi);
        _error = ret;

        return -1;
    }

    return len;
}